

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::AlgebraicExpression<mp::QuadAndLinTerms>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *con,int i
          ,ConstraintAcceptanceLevel param_3,ExpressionAcceptanceLevel param_4)

{
  if (*(int *)(this + 0x40) == 1) {
    HandleLogicalArgs<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
              (this,con,i);
  }
  return false;
}

Assistant:

bool ConvertWithExpressions(
      const ComplementarityConstraint<Expr>& con,
      int i,
      ConstraintAcceptanceLevel , ExpressionAcceptanceLevel ) {
    if (1==stage_cvt2expr_)
      HandleLogicalArgs(con, i);         // explicify logical args
    if (false                      // TODO check acc for NLCompl
        && 1==stage_cvt2expr_
        && !con.GetExpression().is_variable()) {             // already a variable
      ConvertComplementarityExpr(con, i);
      return true;
    }
    return false;
  }